

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgReadMonitorInfo(ZvgMon_s *mon)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint readLen;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = 0;
  if (((byte)ZvgIO.ecpFlags & 1) == 0) {
    uVar1 = zvgSetEcpMode();
  }
  if (uVar1 == 0) {
    zvgEcpPutc(0xec);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    uVar1 = zvgIsDataAvail(1000);
    if (uVar1 == 0) {
      uVar2 = zvgGetMem(ZvgIO.mBfr,0x100,&local_24);
      uVar1 = 0x14;
      if (local_24 == 0xb) {
        uVar1 = uVar2;
      }
      if (uVar2 != 0) {
        uVar1 = uVar2;
      }
      if (uVar1 == 0) {
        mon->point_i = ZvgIO.mBfr[0];
        mon->zShift = ZvgIO.mBfr[1];
        mon->oShoot = ZvgIO.mBfr[2];
        mon->jumpFactor = ZvgIO.mBfr[3];
        mon->settle = ZvgIO.mBfr[4];
        mon->min_i = ZvgIO.mBfr[5];
        mon->max_i = ZvgIO.mBfr[6];
        mon->scale = ZvgIO.mBfr[7];
        mon->flags = ZvgIO.mBfr[8];
        mon->cksum = ZvgIO.mBfr._9_2_;
      }
      uVar2 = zvgSetEcpMode();
      if (uVar2 != 0) {
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

uint zvgReadMonitorInfo( ZvgMon_s *mon)
{
	uint	readLen, ecpErr, err=0;

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
		err = zvgSetEcpMode();				// if not ECP mode, set to ECP mode

	if (err)
		return (err);							// return on any errors

	// request monitor information
	//
	// The ZVG has a 9 byte look ahead buffer.  Until at least 9 bytes are
	// in it's command buffer, nothing will get executed.  This requires
	// the zcREAD_MON command to be followed by 8 NOPs in order to guarantee
	// execution.

	zvgEcpPutc( zcREAD_MON);				// setup to read monitor information
	zvgEcpPutc( zcNOP);						// must fill enough of buffer to allow
	zvgEcpPutc( zcNOP);						// READ_MON to execute
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);

	// wait for command to execute, this could be behind a bunch of vector commands

	err = zvgIsDataAvail( 1000);			// allow a second for data to show up

	if (err)
		return (err);

	// read monitor information into a simple buffer

	err = zvgGetMem( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &readLen);

	if (!err && (readLen != ZVG_MON_SIZE))
		err = errEcpBadData;

	if (!err)
	{
		// GCC does not pack its structure by default, so we need to move each value
		// one byte at a time

		mon->point_i = ZvgIO.mBfr[0];
		mon->zShift = ZvgIO.mBfr[1];
		mon->oShoot = ZvgIO.mBfr[2];
		mon->jumpFactor = ZvgIO.mBfr[3];
		mon->settle = ZvgIO.mBfr[4];
		mon->min_i = ZvgIO.mBfr[5];
		mon->max_i = ZvgIO.mBfr[6];
		mon->scale = ZvgIO.mBfr[7];
		mon->flags = ZvgIO.mBfr[8];

		// for word data, LSB byte is first.

		mon->cksum = ZvgIO.mBfr[9] + ((ushort)ZvgIO.mBfr[10] << 8);
	}

	// return to ECP mode

	ecpErr = zvgSetEcpMode();

	if (ecpErr)
		err = ecpErr;							// an ECP error has higher priority than a bad data error

	return (err);
}